

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithitools.cpp
# Opt level: O0

int check_execution_mode(ithi_tool_mode proposed,ithi_tool_mode *current)

{
  int local_1c;
  int exit_code;
  ithi_tool_mode *current_local;
  ithi_tool_mode proposed_local;
  
  local_1c = 0;
  if ((*current == ithi_mode_unspecified) || (proposed == ithi_mode_unspecified)) {
    *current = proposed;
  }
  else {
    fprintf(_stderr,"Can only specify one execution mode!\n");
    local_1c = usage();
  }
  return local_1c;
}

Assistant:

static int check_execution_mode(ithi_tool_mode proposed, ithi_tool_mode * current)
{
    int exit_code = 0;
    if (*current != ithi_mode_unspecified && proposed != 0)
    {
        fprintf(stderr, "Can only specify one execution mode!\n");
        exit_code = usage();
    }
    else
    {
        *current = proposed;
    }

    return exit_code;
}